

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O3

ostream * tcb::operator<<(ostream *os,rational<char> *r)

{
  ostream *poVar1;
  char local_13;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_13,1);
  if (r->denom_ != '\x01') {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_12,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}